

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  datetime local_f0;
  duration<1UL> local_b8;
  seconds another_ten_years;
  undefined1 local_78 [8];
  datetime ten_years_from_now;
  duration<31536000UL> local_38;
  duration<31536000UL> local_30;
  duration<31536000UL> one_year_and_quarter;
  years half_year;
  years ten_years;
  char **argv_local;
  int argc_local;
  
  setlocale(6,"");
  asap::duration<31536000UL>::duration(&half_year,10.0);
  asap::duration<31536000UL>::duration(&one_year_and_quarter,0.5);
  asap::duration<31536000UL>::duration(&local_38,1.0);
  asap::duration<2592000UL>::duration((duration<2592000UL> *)&ten_years_from_now.when.tm_zone,3.0);
  local_30 = asap::operator+(&local_38,(duration<2592000UL> *)&ten_years_from_now.when.tm_zone);
  asap::now();
  asap::operator+((datetime *)local_78,(datetime *)&another_ten_years,&half_year);
  asap::now();
  local_b8.value = (double)asap::datetime::operator-((datetime *)local_78,&local_f0);
  poVar1 = std::operator<<((ostream *)&std::cout,"ten_years            ->   ");
  pbVar2 = asap::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar1,&half_year);
  std::ostream::operator<<((ostream *)pbVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"one_year_and_quarter ->   ");
  pbVar2 = asap::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar1,&local_30);
  std::ostream::operator<<((ostream *)pbVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"ten_years_from_now   ->   ");
  pbVar2 = asap::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar1,
                            (datetime *)local_78);
  std::ostream::operator<<((ostream *)pbVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"another_ten_years    ->   ");
  pbVar2 = asap::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar1,&local_b8);
  std::ostream::operator<<((ostream *)pbVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"half_year            ->   ");
  pbVar2 = asap::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar1,
                            &one_year_and_quarter);
  std::ostream::operator<<((ostream *)pbVar2,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main(int argc, char * argv[]) {
  /* Setting locale helps with local time format. It is not required. */
  setlocale(LC_ALL, "");

  /* duration types represent durations in various granularities, from seconds to days. */
  auto ten_years = asap::years(10);

  /* you can specify a fraction of a duration: */
  auto half_year = asap::years(0.5f);

  /* you can sum and subtract durations. be aware that the right operand will be converted to the first operand
   * granularity (i.e, when adding years + days, days will be converted to a fraction of a year) */
  auto one_year_and_quarter = asap::years(1) + asap::months(3);

  /* you can add or subtract a duration from a datetime */
  auto ten_years_from_now = asap::now() + ten_years;

  /* subtracting two datetimes yields a duration, in seconds */
  auto another_ten_years = ten_years_from_now - asap::now();

  std::cout << "ten_years            ->   " << ten_years << std::endl;
  std::cout << "one_year_and_quarter ->   " << one_year_and_quarter << std::endl;
  std::cout << "ten_years_from_now   ->   " << ten_years_from_now << std::endl;
  std::cout << "another_ten_years    ->   " << another_ten_years << std::endl;

  /* be aware that for printing and arithmethics, a month has 30 days, thus half an year
   * is actually 6 months, 2 days and 12 hours. asap::years(0.5) != asap::months(6) */
  std::cout << "half_year            ->   " << half_year << std::endl;

  return 0;
}